

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

Id __thiscall
dxil_spv::Converter::Impl::create_bindless_heap_variable(Impl *this,BindlessInfo *info)

{
  ResourceKind RVar1;
  RawVecSize RVar2;
  BindlessResource *pBVar3;
  Impl *this_00;
  bool bVar4;
  ComponentType CVar5;
  RawType RVar6;
  uint uVar7;
  Id IVar8;
  Id sizeId;
  Dim dim;
  Builder *pBVar9;
  Builder *this_01;
  LoggingCallback p_Var10;
  void *pvVar11;
  mapped_type *this_02;
  Decoration decoration;
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  uint uVar12;
  StorageClass storage;
  long lVar13;
  Capability CVar14;
  __normal_iterator<dxil_spv::Converter::Impl::BindlessResource_*,_std::vector<dxil_spv::Converter::Impl::BindlessResource,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::BindlessResource>_>_>
  _Var15;
  bool ms;
  long lVar16;
  Impl *this_03;
  __normal_iterator<dxil_spv::Converter::Impl::BindlessResource_*,_std::vector<dxil_spv::Converter::Impl::BindlessResource,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::BindlessResource>_>_>
  __it;
  ImageFormat format;
  Id local_107c;
  Impl *local_1078;
  Id local_106c;
  value_type local_1068;
  Vector<BindlessResource> *local_1040;
  char buffer [4096];
  
  local_1040 = &this->bindless_resources;
  __it._M_current =
       (this->bindless_resources).
       super__Vector_base<dxil_spv::Converter::Impl::BindlessResource,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::BindlessResource>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pBVar3 = (this->bindless_resources).
           super__Vector_base<dxil_spv::Converter::Impl::BindlessResource,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::BindlessResource>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  buffer._0_2_ = SUB82(info,0);
  buffer._2_2_ = (undefined2)((ulong)info >> 0x10);
  buffer._4_4_ = (undefined4)((ulong)info >> 0x20);
  lVar16 = (long)pBVar3 - (long)__it._M_current;
  local_1078 = this;
  for (lVar13 = lVar16 / 0x28 >> 2; _Var15._M_current = __it._M_current, 0 < lVar13;
      lVar13 = lVar13 + -1) {
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<dxil_spv::Converter::Impl::create_bindless_heap_variable(dxil_spv::Converter::Impl::BindlessInfo_const&)::$_0>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_HansKristian_Work[P]dxil_spirv_dxil_converter_cpp:425:80)>
                          *)buffer,__it);
    if (bVar4) goto LAB_0010d693;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<dxil_spv::Converter::Impl::create_bindless_heap_variable(dxil_spv::Converter::Impl::BindlessInfo_const&)::$_0>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_HansKristian_Work[P]dxil_spirv_dxil_converter_cpp:425:80)>
                          *)buffer,__it._M_current + 1);
    _Var15._M_current = __it._M_current + 1;
    if (bVar4) goto LAB_0010d693;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<dxil_spv::Converter::Impl::create_bindless_heap_variable(dxil_spv::Converter::Impl::BindlessInfo_const&)::$_0>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_HansKristian_Work[P]dxil_spirv_dxil_converter_cpp:425:80)>
                          *)buffer,__it._M_current + 2);
    _Var15._M_current = __it._M_current + 2;
    if (bVar4) goto LAB_0010d693;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<dxil_spv::Converter::Impl::create_bindless_heap_variable(dxil_spv::Converter::Impl::BindlessInfo_const&)::$_0>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_HansKristian_Work[P]dxil_spirv_dxil_converter_cpp:425:80)>
                          *)buffer,__it._M_current + 3);
    _Var15._M_current = __it._M_current + 3;
    if (bVar4) goto LAB_0010d693;
    __it._M_current = __it._M_current + 4;
    lVar16 = lVar16 + -0xa0;
  }
  lVar16 = lVar16 / 0x28;
  if (lVar16 == 1) {
LAB_0010d8e1:
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<dxil_spv::Converter::Impl::create_bindless_heap_variable(dxil_spv::Converter::Impl::BindlessInfo_const&)::$_0>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_HansKristian_Work[P]dxil_spirv_dxil_converter_cpp:425:80)>
                          *)buffer,__it);
    _Var15._M_current = __it._M_current;
    if (!bVar4) {
      _Var15._M_current = pBVar3;
    }
LAB_0010d693:
    if (_Var15._M_current != pBVar3) {
      return (_Var15._M_current)->var_id;
    }
  }
  else {
    if (lVar16 == 2) {
LAB_0010d66e:
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<dxil_spv::Converter::Impl::create_bindless_heap_variable(dxil_spv::Converter::Impl::BindlessInfo_const&)::$_0>
              ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_HansKristian_Work[P]dxil_spirv_dxil_converter_cpp:425:80)>
                            *)buffer,__it);
      _Var15._M_current = __it._M_current;
      if (!bVar4) {
        __it._M_current = __it._M_current + 1;
        goto LAB_0010d8e1;
      }
      goto LAB_0010d693;
    }
    if (lVar16 == 3) {
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<dxil_spv::Converter::Impl::create_bindless_heap_variable(dxil_spv::Converter::Impl::BindlessInfo_const&)::$_0>
              ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_HansKristian_Work[P]dxil_spirv_dxil_converter_cpp:425:80)>
                            *)buffer,__it);
      if (!bVar4) {
        __it._M_current = __it._M_current + 1;
        goto LAB_0010d66e;
      }
      goto LAB_0010d693;
    }
  }
  this_03 = local_1078;
  local_1068.var_id = 0;
  local_1068.info.binding = info->binding;
  local_1068.info.type = info->type;
  local_1068.info.component = info->component;
  local_1068.info._2_2_ = *(undefined2 *)&info->field_0x2;
  local_1068.info.raw_vecsize = info->raw_vecsize;
  local_1068.info.kind = info->kind;
  local_1068.info._9_3_ = *(undefined3 *)&info->field_0x9;
  local_1068.info.format = info->format;
  local_1068.info.descriptor_type = info->descriptor_type;
  local_1068.info.uav_read = info->uav_read;
  local_1068.info.uav_written = info->uav_written;
  local_1068.info.uav_coherent = info->uav_coherent;
  local_1068.info.counters = info->counters;
  local_1068.info.offsets = info->offsets;
  local_1068.info.aliased = info->aliased;
  local_1068.info.relaxed_precision = info->relaxed_precision;
  local_1068.info._27_1_ = info->field_0x1b;
  local_1068.info.desc_set = info->desc_set;
  IVar8 = 0;
  switch(info->type) {
  case SRV:
    if (info->kind == RTAccelerationStructure) {
      if (info->descriptor_type == SSBO) {
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
        basic_string((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                      *)buffer,"RTASHeap",(ThreadLocalAllocator<char> *)&local_107c);
        IVar8 = build_ssbo_runtime_array_type
                          (this_03,Integer,0x20,2,1,
                           (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                            *)buffer);
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
        _M_dispose((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                    *)buffer);
        goto LAB_0010d8d5;
      }
      pBVar9 = builder(local_1078);
      IVar8 = spv::Builder::makeAccelerationStructureType(pBVar9);
      goto LAB_0010d79c;
    }
    CVar5 = info->component;
    if (info->descriptor_type == SSBO) {
      RVar6 = raw_component_type_to_type(CVar5);
      uVar7 = raw_component_type_to_bits(info->component);
      if (info->offsets == true) {
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
        basic_string((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                      *)buffer,"SSBO_Offsets",(ThreadLocalAllocator<char> *)&local_107c);
        IVar8 = build_ssbo_runtime_array_type
                          (this_03,RVar6,0x20,2,1,
                           (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                            *)buffer);
      }
      else {
        RVar2 = info->raw_vecsize;
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
        basic_string((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                      *)buffer,"SSBO",(ThreadLocalAllocator<char> *)&local_107c);
        IVar8 = build_ssbo_runtime_array_type
                          (this_03,RVar6,uVar7,RVar2 + V2,0xffffffff,
                           (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                            *)buffer);
      }
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::_M_dispose
                ((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                  *)buffer);
      storage = StorageClassStorageBuffer;
      if (uVar7 == 8) {
        pBVar9 = builder(this_03);
        spv::Builder::addExtension(pBVar9,"SPV_KHR_8bit_storage");
        pBVar9 = builder(this_03);
        CVar14 = CapabilityStorageBuffer8BitAccess;
LAB_0010de48:
        storage = StorageClassStorageBuffer;
        spv::Builder::addCapability(pBVar9,CVar14);
      }
      else if (uVar7 == 0x10) {
        pBVar9 = builder(this_03);
        goto LAB_0010dd98;
      }
    }
    else {
      if ((9 < CVar5) || ((0x230U >> (CVar5 & 0x1f) & 1) == 0)) {
LAB_0010dda5:
        p_Var10 = get_thread_log_callback();
        if (p_Var10 != (LoggingCallback)0x0) {
          builtin_strncpy(buffer,"Invalid component type for image.\n",0x23);
          pvVar11 = get_thread_log_callback_userdata();
          (*p_Var10)(pvVar11,Error,buffer);
          return 0;
        }
        fwrite("[ERROR]: Invalid component type for image.\n",0x2b,1,_stderr);
        fflush(_stderr);
        return 0;
      }
      local_106c = get_type_id(local_1078,CVar5,1,1,false);
      pBVar9 = builder(this_03);
      RVar1 = info->kind;
      dim = image_dimension_from_resource_kind(RVar1);
      bVar4 = (bool)((byte)(0x403c0 >> (RVar1 & (RTAccelerationStructure|TBuffer))) &
                    RVar1 < (FeedbackTexture2DArray|Texture1D));
      ms = RVar1 == Texture2DMS || RVar1 == Texture2DMSArray;
      format = ImageFormatUnknown;
      uVar7 = 1;
LAB_0010dcfc:
      this_03 = local_1078;
      storage = StorageClassUniformConstant;
      IVar8 = spv::Builder::makeImageType(pBVar9,local_106c,dim,false,bVar4,ms,uVar7,format);
      pBVar9 = builder(this_03);
      IVar8 = spv::Builder::makeRuntimeArray(pBVar9,IVar8);
    }
    break;
  case UAV:
    if (info->counters == true) {
      pBVar9 = builder(local_1078);
      IVar8 = spv::Builder::makeUintType(pBVar9,0x20);
      pBVar9 = builder(this_03);
      IVar8 = spv::Builder::makeVectorType(pBVar9,IVar8,2);
      pBVar9 = builder(this_03);
      IVar8 = spv::Builder::makeRuntimeArray(pBVar9,IVar8);
      pBVar9 = builder(this_03);
      spv::Builder::addDecoration(pBVar9,IVar8,DecorationArrayStride,8);
      buffer[0] = '\0';
      buffer[1] = '\0';
      buffer[2] = '\0';
      buffer[3] = '\0';
      buffer[4] = '\0';
      buffer[5] = '\0';
      buffer[6] = '\0';
      buffer[7] = '\0';
      buffer[8] = '\0';
      buffer[9] = '\0';
      buffer[10] = '\0';
      buffer[0xb] = '\0';
      buffer[0xc] = '\0';
      buffer[0xd] = '\0';
      buffer[0xe] = '\0';
      buffer[0xf] = '\0';
      buffer[0x10] = '\0';
      buffer[0x11] = '\0';
      buffer[0x12] = '\0';
      buffer[0x13] = '\0';
      buffer[0x14] = '\0';
      buffer[0x15] = '\0';
      buffer[0x16] = '\0';
      buffer[0x17] = '\0';
      local_107c = IVar8;
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_range_initialize<unsigned_int_const*>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)buffer,
                 &local_107c);
      IVar8 = get_struct_type(this_03,(Vector<spv::Id> *)buffer,0,"AtomicCounters");
      std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)buffer
                );
      pBVar9 = builder(this_03);
      spv::Builder::addDecoration(pBVar9,IVar8,DecorationBlock,-1);
      pBVar9 = builder(this_03);
      spv::Builder::addMemberName(pBVar9,IVar8,0,"counters");
      pBVar9 = builder(this_03);
      spv::Builder::addMemberDecoration(pBVar9,IVar8,0,DecorationOffset,0);
      pBVar9 = builder(this_03);
      spv::Builder::addMemberDecoration(pBVar9,IVar8,0,DecorationNonWritable,-1);
LAB_0010d8d5:
      storage = StorageClassStorageBuffer;
    }
    else {
      CVar5 = info->component;
      if (info->descriptor_type != SSBO) {
        if ((9 < CVar5) || ((0x2b0U >> (CVar5 & 0x1f) & 1) == 0)) goto LAB_0010dda5;
        local_106c = get_type_id(local_1078,CVar5,1,1,false);
        pBVar9 = builder(this_03);
        RVar1 = info->kind;
        dim = image_dimension_from_resource_kind(RVar1);
        bVar4 = (bool)((byte)(0x403c0 >> (RVar1 & (RTAccelerationStructure|TBuffer))) &
                      RVar1 < (FeedbackTexture2DArray|Texture1D));
        ms = RVar1 == Texture2DMS || RVar1 == Texture2DMSArray;
        format = info->format;
        uVar7 = 2;
        goto LAB_0010dcfc;
      }
      RVar6 = raw_component_type_to_type(CVar5);
      uVar7 = raw_component_type_to_bits(info->component);
      RVar2 = info->raw_vecsize;
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
      basic_string((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                    *)buffer,"SSBO",(ThreadLocalAllocator<char> *)&local_107c);
      IVar8 = build_ssbo_runtime_array_type
                        (this_03,RVar6,uVar7,RVar2 + V2,0xffffffff,
                         (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                          *)buffer);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::_M_dispose
                ((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                  *)buffer);
      storage = StorageClassStorageBuffer;
      if (uVar7 == 8) {
        pBVar9 = builder(this_03);
        spv::Builder::addExtension(pBVar9,"SPV_KHR_8bit_storage");
        pBVar9 = builder(this_03);
        CVar14 = CapabilityStorageBuffer8BitAccess;
      }
      else {
        if (uVar7 != 0x10) break;
        pBVar9 = builder(this_03);
        CVar14 = CapabilityStorageBuffer16BitAccess;
      }
      spv::Builder::addCapability(pBVar9,CVar14);
    }
    break;
  case CBV:
    RVar6 = raw_component_type_to_type(info->component);
    uVar7 = raw_component_type_to_bits(info->component);
    this_00 = local_1078;
    uVar12 = info->raw_vecsize + V2;
    pBVar9 = builder(local_1078);
    if (RVar6 == Integer) {
      IVar8 = spv::Builder::makeUintType(pBVar9,uVar7);
    }
    else {
      IVar8 = spv::Builder::makeFloatType(pBVar9,uVar7);
    }
    if (1 < uVar12) {
      pBVar9 = builder(this_00);
      IVar8 = spv::Builder::makeVectorType(pBVar9,IVar8,uVar12);
    }
    uVar12 = uVar12 * (uVar7 >> 3);
    pBVar9 = builder(this_00);
    this_01 = builder(this_00);
    sizeId = spv::Builder::makeUintConstant(this_01,(uint)(0x10000 / (ulong)uVar12),false);
    IVar8 = spv::Builder::makeArrayType(pBVar9,IVar8,sizeId,uVar12);
    pBVar9 = builder(this_00);
    spv::Builder::addDecoration(pBVar9,IVar8,DecorationArrayStride,uVar12);
    buffer[0] = '\0';
    buffer[1] = '\0';
    buffer[2] = '\0';
    buffer[3] = '\0';
    buffer[4] = '\0';
    buffer[5] = '\0';
    buffer[6] = '\0';
    buffer[7] = '\0';
    buffer[8] = '\0';
    buffer[9] = '\0';
    buffer[10] = '\0';
    buffer[0xb] = '\0';
    buffer[0xc] = '\0';
    buffer[0xd] = '\0';
    buffer[0xe] = '\0';
    buffer[0xf] = '\0';
    buffer[0x10] = '\0';
    buffer[0x11] = '\0';
    buffer[0x12] = '\0';
    buffer[0x13] = '\0';
    buffer[0x14] = '\0';
    buffer[0x15] = '\0';
    buffer[0x16] = '\0';
    buffer[0x17] = '\0';
    local_107c = IVar8;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_range_initialize<unsigned_int_const*>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)buffer,
               &local_107c);
    IVar8 = get_struct_type(this_00,(Vector<spv::Id> *)buffer,0,"BindlessCBV");
    std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)buffer);
    pBVar9 = builder(this_00);
    spv::Builder::addDecoration(pBVar9,IVar8,DecorationBlock,-1);
    if ((this_00->options).bindless_cbv_ssbo_emulation == true) {
      pBVar9 = builder(this_00);
      spv::Builder::addMemberDecoration(pBVar9,IVar8,0,DecorationNonWritable,-1);
    }
    pBVar9 = builder(this_00);
    spv::Builder::addMemberDecoration(pBVar9,IVar8,0,DecorationOffset,0);
    pBVar9 = builder(this_00);
    IVar8 = spv::Builder::makeRuntimeArray(pBVar9,IVar8);
    this_03 = local_1078;
    bVar4 = (this_00->options).bindless_cbv_ssbo_emulation;
    storage = StorageClassUniform;
    if (bVar4 != false) {
      storage = StorageClassStorageBuffer;
    }
    if (uVar7 == 8) {
      pBVar9 = builder(local_1078);
      spv::Builder::addExtension(pBVar9,"SPV_KHR_8bit_storage");
      bVar4 = (this_03->options).bindless_cbv_ssbo_emulation;
      pBVar9 = builder(this_03);
      if (bVar4 == true) {
        CVar14 = CapabilityStorageBuffer8BitAccess;
      }
      else {
        CVar14 = CapabilityUniformAndStorageBuffer8BitAccess;
      }
      spv::Builder::addCapability(pBVar9,CVar14);
      this_03 = local_1078;
    }
    else if (uVar7 == 0x10) {
      pBVar9 = builder(local_1078);
      if (bVar4 != false) {
LAB_0010dd98:
        CVar14 = CapabilityStorageBuffer16BitAccess;
        goto LAB_0010de48;
      }
      spv::Builder::addCapability(pBVar9,CapabilityStorageUniform16);
      storage = StorageClassUniform;
    }
    break;
  case Sampler:
    pBVar9 = builder(local_1078);
    IVar8 = spv::Builder::makeSamplerType(pBVar9);
LAB_0010d79c:
    pBVar9 = builder(this_03);
    IVar8 = spv::Builder::makeRuntimeArray(pBVar9,IVar8);
    storage = StorageClassUniformConstant;
    break;
  default:
    goto switchD_0010d6e2_default;
  }
  pBVar9 = builder(this_03);
  spv::Builder::addExtension(pBVar9,"SPV_EXT_descriptor_indexing");
  pBVar9 = builder(this_03);
  spv::Builder::addCapability(pBVar9,CapabilityRuntimeDescriptorArray);
  local_1068.var_id = create_variable(this_03,storage,IVar8,(char *)0x0);
  this_02 = std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this_03->handle_to_resource_meta,&local_1068.var_id);
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  buffer[8] = '\0';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0xf] = '\0';
  buffer[0x10] = '\0';
  buffer[0x11] = '\0';
  buffer[0x12] = '\0';
  buffer[0x13] = '\0';
  buffer[0x14] = '\0';
  buffer[0x15] = '\0';
  buffer[0x16] = '\0';
  buffer[0x17] = '\0';
  buffer[0x18] = '\0';
  buffer[0x19] = '\0';
  buffer[0x1a] = '\0';
  buffer[0x1b] = '\0';
  buffer[0x1c] = '\0';
  buffer[0x1d] = '\0';
  buffer[0x1e] = '\0';
  buffer[0x1f] = '\0';
  buffer[0x20] = '\0';
  buffer[0x21] = '\0';
  buffer[0x22] = '\0';
  buffer[0x23] = '\0';
  buffer[0x24] = '\0';
  buffer[0x25] = '\0';
  buffer[0x26] = '\0';
  buffer[0x27] = '\0';
  buffer[0x28] = '\0';
  buffer[0x29] = '\0';
  buffer[0x2a] = '\0';
  buffer[0x2b] = '\0';
  buffer[0x2c] = '\0';
  buffer[0x2d] = '\0';
  buffer[0x2e] = '\0';
  buffer[0x2f] = '\0';
  buffer[0x30] = '\0';
  buffer[0x31] = '\0';
  buffer[0x32] = '\0';
  buffer[0x33] = '\0';
  buffer[0x34] = '\0';
  buffer[0x35] = '\0';
  buffer[0x36] = '\0';
  buffer[0x37] = '\0';
  buffer[0x38] = '\0';
  buffer[0x3c] = '\0';
  buffer[0x3d] = '\0';
  buffer[0x3e] = '\0';
  buffer[0x3f] = '\0';
  buffer[0x40] = '\0';
  buffer[0x41] = '\0';
  buffer[0x42] = '\0';
  buffer[0x43] = '\0';
  buffer[0x44] = '\0';
  buffer[0x45] = '\0';
  buffer[0x46] = '\0';
  buffer[0x47] = '\0';
  buffer[0x48] = '\0';
  buffer[0x49] = '\0';
  buffer[0x4a] = '\0';
  buffer[0x4b] = '\0';
  buffer[0x4c] = '\0';
  buffer[0x4d] = '\0';
  buffer[0x4e] = '\0';
  buffer[0x4f] = '\0';
  ResourceMeta::operator=(this_02,(ResourceMeta *)buffer);
  std::
  _Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
  ::~_Vector_base((_Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                   *)(buffer + 0x10));
  this_02->kind = info->kind;
  this_02->component_type = info->component;
  this_02->raw_component_vecsize = info->raw_vecsize;
  this_02->var_id = local_1068.var_id;
  this_02->storage = storage;
  pBVar9 = builder(this_03);
  spv::Builder::addDecoration(pBVar9,local_1068.var_id,DecorationDescriptorSet,info->desc_set);
  pBVar9 = builder(this_03);
  spv::Builder::addDecoration(pBVar9,local_1068.var_id,DecorationBinding,info->binding);
  if (info->relaxed_precision == true) {
    pBVar9 = builder(this_03);
    spv::Builder::addDecoration(pBVar9,local_1068.var_id,DecorationRelaxedPrecision,-1);
    CVar5 = this_02->component_type;
    if (CVar5 == F32) {
      CVar5 = F16;
    }
    else if (CVar5 == U32) {
      CVar5 = U16;
    }
    else {
      if (CVar5 != I32) goto LAB_0010df7e;
      CVar5 = I16;
    }
    this_02->component_type = CVar5;
  }
LAB_0010df7e:
  if ((info->type == UAV) && ((info->counters & 1U) == 0)) {
    if (info->uav_read == false) {
      pBVar9 = builder(this_03);
      spv::Builder::addDecoration(pBVar9,local_1068.var_id,DecorationNonReadable,-1);
    }
    if (info->uav_written == false) {
      pBVar9 = builder(this_03);
      spv::Builder::addDecoration(pBVar9,local_1068.var_id,DecorationNonWritable,-1);
    }
    if (info->uav_coherent != false) {
      decoration = DecorationCoherent;
      goto LAB_0010e016;
    }
  }
  else {
    decoration = DecorationAliasedPointer;
    if ((info->counters & 1U) == 0) {
      if ((info->type != SRV) || (info->descriptor_type != SSBO)) goto LAB_0010e02f;
      pBVar9 = builder(this_03);
      spv::Builder::addDecoration(pBVar9,local_1068.var_id,DecorationNonWritable,-1);
      decoration = DecorationRestrict;
    }
LAB_0010e016:
    pBVar9 = builder(this_03);
    spv::Builder::addDecoration(pBVar9,local_1068.var_id,decoration,-1);
  }
LAB_0010e02f:
  if ((info->aliased == true) && (info->type == UAV)) {
    pBVar9 = builder(this_03);
    spv::Builder::addDecoration(pBVar9,local_1068.var_id,DecorationAliased,-1);
  }
  std::
  vector<dxil_spv::Converter::Impl::BindlessResource,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::BindlessResource>_>
  ::push_back(local_1040,&local_1068);
  IVar8 = local_1068.var_id;
switchD_0010d6e2_default:
  return IVar8;
}

Assistant:

spv::Id Converter::Impl::create_bindless_heap_variable(const BindlessInfo &info)
{
	auto itr = std::find_if(bindless_resources.begin(), bindless_resources.end(), [&](const BindlessResource &resource) {
		return
			resource.info.type == info.type &&
			resource.info.component == info.component &&
			resource.info.raw_vecsize == info.raw_vecsize &&
			resource.info.kind == info.kind &&
			resource.info.desc_set == info.desc_set &&
			resource.info.format == info.format &&
			resource.info.binding == info.binding &&
			resource.info.uav_read == info.uav_read &&
			resource.info.uav_written == info.uav_written &&
			resource.info.uav_coherent == info.uav_coherent &&
			resource.info.relaxed_precision == info.relaxed_precision &&
			resource.info.aliased == info.aliased &&
			resource.info.counters == info.counters &&
			resource.info.offsets == info.offsets &&
			resource.info.descriptor_type == info.descriptor_type;
	});

	if (itr != bindless_resources.end())
	{
		return itr->var_id;
	}
	else
	{
		BindlessResource resource = {};
		resource.info = info;

		spv::Id type_id = 0;
		auto storage = spv::StorageClassMax;

		switch (info.type)
		{
		case DXIL::ResourceType::SRV:
		{
			if (info.kind == DXIL::ResourceKind::RTAccelerationStructure)
			{
				if (info.descriptor_type == VulkanDescriptorType::SSBO)
				{
					type_id = build_ssbo_runtime_array_type(*this, RawType::Integer, 32, 2, 1, "RTASHeap");
					storage = spv::StorageClassStorageBuffer;
				}
				else
				{
					type_id = builder().makeAccelerationStructureType();
					type_id = builder().makeRuntimeArray(type_id);
					storage = spv::StorageClassUniformConstant;
				}
			}
			else if (info.descriptor_type == VulkanDescriptorType::SSBO)
			{
				RawType raw_type = raw_component_type_to_type(info.component);
				unsigned bits = raw_component_type_to_bits(info.component);

				if (info.offsets)
					type_id = build_ssbo_runtime_array_type(*this, raw_type, 32, 2, 1, "SSBO_Offsets");
				else
					type_id = build_ssbo_runtime_array_type(*this, raw_type, bits, raw_vecsize_to_vecsize(info.raw_vecsize),
					                                        ~0u, "SSBO");
				storage = spv::StorageClassStorageBuffer;
				if (bits == 16)
					builder().addCapability(spv::CapabilityStorageBuffer16BitAccess);
				else if (bits == 8)
				{
					builder().addExtension("SPV_KHR_8bit_storage");
					builder().addCapability(spv::CapabilityStorageBuffer8BitAccess);
				}
			}
			else
			{
				if (info.component != DXIL::ComponentType::U32 &&
				    info.component != DXIL::ComponentType::I32 &&
				    info.component != DXIL::ComponentType::F32)
				{
					LOGE("Invalid component type for image.\n");
					return 0;
				}

				spv::Id sampled_type_id = get_type_id(info.component, 1, 1);
				type_id = builder().makeImageType(sampled_type_id, image_dimension_from_resource_kind(info.kind), false,
				                                  image_dimension_is_arrayed(info.kind),
				                                  image_dimension_is_multisampled(info.kind), 1, spv::ImageFormatUnknown);
				type_id = builder().makeRuntimeArray(type_id);
				storage = spv::StorageClassUniformConstant;
			}
			break;
		}

		case DXIL::ResourceType::UAV:
		{
			if (info.counters)
			{
				spv::Id uint_type = builder().makeUintType(32);
				spv::Id uvec2_type = builder().makeVectorType(uint_type, 2);

				spv::Id runtime_array_type_id = builder().makeRuntimeArray(uvec2_type);
				builder().addDecoration(runtime_array_type_id, spv::DecorationArrayStride, sizeof(uint64_t));

				type_id = get_struct_type({ runtime_array_type_id }, 0, "AtomicCounters");
				builder().addDecoration(type_id, spv::DecorationBlock);
				builder().addMemberName(type_id, 0, "counters");
				builder().addMemberDecoration(type_id, 0, spv::DecorationOffset, 0);
				builder().addMemberDecoration(type_id, 0, spv::DecorationNonWritable);
				storage = spv::StorageClassStorageBuffer;
			}
			else if (info.descriptor_type == VulkanDescriptorType::SSBO)
			{
				RawType raw_type = raw_component_type_to_type(info.component);
				unsigned bits = raw_component_type_to_bits(info.component);

				type_id = build_ssbo_runtime_array_type(*this, raw_type, bits, raw_vecsize_to_vecsize(info.raw_vecsize),
				                                        ~0u, "SSBO");
				storage = spv::StorageClassStorageBuffer;
				if (bits == 16)
					builder().addCapability(spv::CapabilityStorageBuffer16BitAccess);
				else if (bits == 8)
				{
					builder().addExtension("SPV_KHR_8bit_storage");
					builder().addCapability(spv::CapabilityStorageBuffer8BitAccess);
				}
			}
			else
			{
				if (info.component != DXIL::ComponentType::U32 &&
				    info.component != DXIL::ComponentType::I32 &&
				    info.component != DXIL::ComponentType::F32 &&
				    info.component != DXIL::ComponentType::U64)
				{
					LOGE("Invalid component type for image.\n");
					return 0;
				}

				spv::Id sampled_type_id = get_type_id(info.component, 1, 1);
				type_id = builder().makeImageType(sampled_type_id, image_dimension_from_resource_kind(info.kind), false,
				                                  image_dimension_is_arrayed(info.kind),
				                                  image_dimension_is_multisampled(info.kind), 2, info.format);
				type_id = builder().makeRuntimeArray(type_id);
				storage = spv::StorageClassUniformConstant;
			}
			break;
		}

		case DXIL::ResourceType::Sampler:
			type_id = builder().makeSamplerType();
			type_id = builder().makeRuntimeArray(type_id);
			storage = spv::StorageClassUniformConstant;
			break;

		case DXIL::ResourceType::CBV:
		{
			RawType raw_type = raw_component_type_to_type(info.component);
			unsigned bits = raw_component_type_to_bits(info.component);

			unsigned vecsize = raw_vecsize_to_vecsize(info.raw_vecsize);
			type_id = raw_type == RawType::Float ? builder().makeFloatType(bits) : builder().makeUintType(bits);
			if (vecsize > 1)
				type_id = builder().makeVectorType(type_id, vecsize);

			unsigned element_size = (bits / 8) * vecsize;
			unsigned num_elements = 0x10000 / element_size;

			type_id = builder().makeArrayType(type_id, builder().makeUintConstant(num_elements), element_size);
			builder().addDecoration(type_id, spv::DecorationArrayStride, element_size);
			type_id = get_struct_type({ type_id }, 0, "BindlessCBV");
			builder().addDecoration(type_id, spv::DecorationBlock);
			if (options.bindless_cbv_ssbo_emulation)
				builder().addMemberDecoration(type_id, 0, spv::DecorationNonWritable);
			builder().addMemberDecoration(type_id, 0, spv::DecorationOffset, 0);
			type_id = builder().makeRuntimeArray(type_id);
			storage = options.bindless_cbv_ssbo_emulation ? spv::StorageClassStorageBuffer : spv::StorageClassUniform;

			if (bits == 16)
			{
				if (options.bindless_cbv_ssbo_emulation)
					builder().addCapability(spv::CapabilityStorageBuffer16BitAccess);
				else
					builder().addCapability(spv::CapabilityUniformAndStorageBuffer16BitAccess);
			}
			else if (bits == 8)
			{
				builder().addExtension("SPV_KHR_8bit_storage");
				if (options.bindless_cbv_ssbo_emulation)
					builder().addCapability(spv::CapabilityStorageBuffer8BitAccess);
				else
					builder().addCapability(spv::CapabilityUniformAndStorageBuffer8BitAccess);
			}
			break;
		}

		default:
			return 0;
		}

		builder().addExtension("SPV_EXT_descriptor_indexing");
		builder().addCapability(spv::CapabilityRuntimeDescriptorArrayEXT);
		resource.var_id = create_variable(storage, type_id);

		auto &meta = handle_to_resource_meta[resource.var_id];
		meta = {};
		meta.kind = info.kind;
		meta.component_type = info.component;
		meta.raw_component_vecsize = info.raw_vecsize;
		meta.var_id = resource.var_id;
		meta.storage = storage;

		builder().addDecoration(resource.var_id, spv::DecorationDescriptorSet, info.desc_set);
		builder().addDecoration(resource.var_id, spv::DecorationBinding, info.binding);

		if (info.relaxed_precision)
		{
			builder().addDecoration(resource.var_id, spv::DecorationRelaxedPrecision);

			// Signal the intended component type.
			switch (meta.component_type)
			{
			case DXIL::ComponentType::F32:
				meta.component_type = DXIL::ComponentType::F16;
				break;

			case DXIL::ComponentType::I32:
				meta.component_type = DXIL::ComponentType::I16;
				break;

			case DXIL::ComponentType::U32:
				meta.component_type = DXIL::ComponentType::U16;
				break;

			default:
				break;
			}
		}

		if (info.type == DXIL::ResourceType::UAV && !info.counters)
		{
			if (!info.uav_read)
				builder().addDecoration(resource.var_id, spv::DecorationNonReadable);
			if (!info.uav_written)
				builder().addDecoration(resource.var_id, spv::DecorationNonWritable);
			if (info.uav_coherent)
				builder().addDecoration(resource.var_id, spv::DecorationCoherent);
		}
		else if (info.counters)
		{
			builder().addDecoration(resource.var_id, spv::DecorationAliasedPointer);
		}
		else if (info.type == DXIL::ResourceType::SRV && info.descriptor_type == VulkanDescriptorType::SSBO)
		{
			builder().addDecoration(resource.var_id, spv::DecorationNonWritable);
			builder().addDecoration(resource.var_id, spv::DecorationRestrict);
		}

		// The default in Vulkan environment is Restrict.
		if (info.aliased && info.type == DXIL::ResourceType::UAV)
			builder().addDecoration(resource.var_id, spv::DecorationAliased);

		bindless_resources.push_back(resource);
		return resource.var_id;
	}
}